

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O3

NetworkError statusCodeFromHttp(int httpStatusCode,QUrl *url)

{
  NetworkError NVar1;
  long in_FS_OFFSET;
  QArrayData *local_68;
  longlong local_60;
  QArrayData *local_50;
  undefined8 *local_48;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (httpStatusCode < 500) {
    NVar1 = ProtocolInvalidOperationError;
    switch(httpStatusCode) {
    case 400:
    case 0x1a2:
      break;
    case 0x191:
      NVar1 = AuthenticationRequiredError;
      break;
    default:
      goto switchD_00210ba1_caseD_192;
    case 0x193:
      NVar1 = ContentAccessDenied;
      break;
    case 0x194:
      NVar1 = ContentNotFoundError;
      break;
    case 0x195:
      NVar1 = ContentOperationNotPermittedError;
      break;
    case 0x197:
      NVar1 = ProxyAuthenticationRequiredError;
      break;
    case 0x199:
      NVar1 = ContentConflictError;
      break;
    case 0x19a:
      NVar1 = ContentGoneError;
    }
  }
  else {
    if (httpStatusCode == 500) {
      NVar1 = InternalServerError;
      goto switchD_00210ba1_caseD_190;
    }
    if (httpStatusCode == 0x1f5) {
      NVar1 = OperationNotImplementedError;
      goto switchD_00210ba1_caseD_190;
    }
    if (httpStatusCode == 0x1f7) {
      NVar1 = ServiceUnavailableError;
      goto switchD_00210ba1_caseD_190;
    }
switchD_00210ba1_caseD_192:
    NVar1 = UnknownServerError;
    if ((httpStatusCode < 0x1f5) && (NVar1 = UnknownContentError, httpStatusCode < 400)) {
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_20 = "default";
      QUrl::toString(&local_68,url,0);
      QString::toLocal8Bit_helper((QChar *)&local_50,local_60);
      if (local_48 == (undefined8 *)0x0) {
        local_48 = &QByteArray::_empty;
      }
      QMessageLogger::warning
                (local_38,
                 "QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                 httpStatusCode,local_48);
      if (local_50 != (QArrayData *)0x0) {
        LOCK();
        (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_50,1,0x10);
        }
      }
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
      NVar1 = ProtocolFailure;
    }
  }
switchD_00210ba1_caseD_190:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return NVar1;
  }
  __stack_chk_fail();
}

Assistant:

static QNetworkReply::NetworkError statusCodeFromHttp(int httpStatusCode, const QUrl &url)
{
    QNetworkReply::NetworkError code;
    // we've got an error
    switch (httpStatusCode) {
    case 400:               // Bad Request
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 401:               // Authorization required
        code = QNetworkReply::AuthenticationRequiredError;
        break;

    case 403:               // Access denied
        code = QNetworkReply::ContentAccessDenied;
        break;

    case 404:               // Not Found
        code = QNetworkReply::ContentNotFoundError;
        break;

    case 405:               // Method Not Allowed
        code = QNetworkReply::ContentOperationNotPermittedError;
        break;

    case 407:
        code = QNetworkReply::ProxyAuthenticationRequiredError;
        break;

    case 409:               // Resource Conflict
        code = QNetworkReply::ContentConflictError;
        break;

    case 410:               // Content no longer available
        code = QNetworkReply::ContentGoneError;
        break;

    case 418:               // I'm a teapot
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 500:               // Internal Server Error
        code = QNetworkReply::InternalServerError;
        break;

    case 501:               // Server does not support this functionality
        code = QNetworkReply::OperationNotImplementedError;
        break;

    case 503:               // Service unavailable
        code = QNetworkReply::ServiceUnavailableError;
        break;

    default:
        if (httpStatusCode > 500) {
            // some kind of server error
            code = QNetworkReply::UnknownServerError;
        } else if (httpStatusCode >= 400) {
            // content error we did not handle above
            code = QNetworkReply::UnknownContentError;
        } else {
            qWarning("QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                     httpStatusCode, qPrintable(url.toString()));
            code = QNetworkReply::ProtocolFailure;
        }
    }

    return code;
}